

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  char cVar1;
  long lVar2;
  lua_State *plVar3;
  TRef TVar4;
  TRef TVar5;
  ulong uVar6;
  GCproto *pGVar7;
  IROpT IVar8;
  int iVar9;
  ulong uVar10;
  int32_t slot;
  long lVar11;
  ushort uVar12;
  IRRef1 IVar13;
  uint uVar14;
  bool bVar15;
  
  lVar2 = *(long *)((long)J->fn + (ulong)uv * 8 + 0x28);
  TVar4 = getcurrf(J);
  if (*(char *)(lVar2 + 0xb) == '\0') {
LAB_00151393:
    iVar9 = 0;
  }
  else {
    uVar6 = (long)**(ulong **)(lVar2 + 0x20) >> 0x2f;
    if ((uVar6 + 0xd < 2) || (uVar6 == 0xfffffffffffffff9)) {
      bVar15 = true;
    }
    else if (uVar6 == 0xfffffffffffffff5) {
      uVar10 = **(ulong **)(lVar2 + 0x20) & 0x7fffffffffff;
      uVar6 = 0;
      bVar15 = false;
      if ((*(byte *)(uVar10 + 8) & 0x90) == 0) {
        lVar11 = *(long *)J[-1].penalty[0x3b].pc.ptr64;
        uVar6 = (ulong)*(ushort *)(uVar10 + 10);
        if (0x5fffffff < *(uint *)(lVar11 + uVar6 * 0x18)) goto LAB_00151388;
        uVar6 = (ulong)(*(uint *)(lVar11 + uVar6 * 0x18 + 4) < 0x11);
        bVar15 = false;
      }
    }
    else {
LAB_00151388:
      bVar15 = false;
      uVar6 = 1;
    }
    iVar9 = (int)uVar6;
    if (bVar15) goto LAB_00151393;
  }
  if (iVar9 == 0) {
    TVar5 = 0;
    goto LAB_00151417;
  }
  IVar13 = (IRRef1)TVar4;
  if ((short)IVar13 < 0) {
    pGVar7 = J->pt;
    if (pGVar7->flags < 0x60) {
      TVar4 = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
      (J->fold).ins.field_0.ot = 0x888;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold(J);
      J->base[-2] = TVar4;
      goto LAB_001513fb;
    }
    bVar15 = false;
  }
  else {
LAB_001513fb:
    TVar5 = lj_record_constify(J,*(cTValue **)(lVar2 + 0x20));
    pGVar7 = (GCproto *)(ulong)TVar5;
    bVar15 = TVar5 != 0;
  }
  TVar5 = (TRef)pGVar7;
  if (bVar15) {
    return TVar5;
  }
LAB_00151417:
  uVar14 = *(uint *)(lVar2 + 0x28) + 0xfb3ee249;
  iVar9 = (*(uint *)(lVar2 + 0x28) ^ uVar14) - (uVar14 * 0x4000 | uVar14 >> 0x12);
  uVar12 = ((ushort)(uVar14 >> 0xd) ^ (ushort)iVar9) - (ushort)((uint)iVar9 >> 0x13) & 0xff |
           (ushort)(uv << 8);
  cVar1 = *(char *)(lVar2 + 10);
  IVar13 = (IRRef1)TVar4;
  if (cVar1 == '\0') {
    uVar6 = *(ulong *)(lVar2 + 0x20);
    plVar3 = J->L;
    if (((plVar3->stack).ptr64 <= uVar6) && (uVar6 < (plVar3->maxstack).ptr64)) {
      iVar9 = (int)(uVar6 - (long)(plVar3->base + -J->baseslot) >> 3);
      if (-1 < iVar9) {
        (J->fold).ins.field_0.ot = 0x3c09;
        (J->fold).ins.field_0.op1 = IVar13;
        (J->fold).ins.field_0.op2 = uVar12;
        TVar4 = lj_opt_fold(J);
        TVar5 = lj_ir_kint64(J,(long)(iVar9 * -8 + 0x10));
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x889;
        (J->fold).ins.field_0.op1 = 0x8000;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        lj_opt_fold(J);
        lVar11 = (long)iVar9 - (long)(int)J->baseslot;
        slot = (int32_t)lVar11;
        if (val == 0) {
          TVar5 = J->base[lVar11];
          if (TVar5 == 0) {
            TVar5 = sload(J,slot);
          }
        }
        else {
          J->base[lVar11] = val;
          TVar5 = 0;
          if ((int)J->maxslot <= slot) {
            J->maxslot = slot + 1;
          }
        }
      }
      if (-1 < iVar9) {
        return TVar5;
      }
    }
    IVar8 = 0x3c95;
    if ((val >> 0x18 & 0x1f) - 4 < 9) {
      IVar8 = 0x3c89;
    }
    (J->fold).ins.field_0.ot = IVar8;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = uVar12;
    TVar4 = lj_opt_fold(J);
    IVar13 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op1 = IVar13;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x2a098000;
    TVar4 = lj_opt_fold(J);
    TVar5 = lj_ir_kint64(J,(ulong)((J->maxslot + J->baseslot) * 8));
    (J->fold).ins.field_0.ot = 0x789;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    lj_opt_fold(J);
  }
  else {
    (J->fold).ins.field_0.ot = (ushort)(TVar4 >> 8) & 0x80 | 0x3d09;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = uVar12;
    TVar4 = lj_opt_fold(J);
    IVar13 = (IRRef1)TVar4;
  }
  if (val == 0) {
    uVar14 = 0xe;
    if (0xfffffffffffffff1 < (ulong)(**(long **)(lVar2 + 0x20) >> 0x2f)) {
      uVar14 = ~(uint)(**(long **)(lVar2 + 0x20) >> 0x2f);
    }
    (J->fold).ins.field_0.ot = (ushort)uVar14 | 0x4480;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = 0;
    TVar5 = lj_opt_fold(J);
    TVar4 = uVar14 * 0x1000001 ^ 0x7fff;
    if (2 < uVar14) {
      TVar4 = TVar5;
    }
  }
  else {
    if ((val >> 0x18 & 0x1f) - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
      val = lj_opt_fold(J);
    }
    uVar14 = val >> 0x18 & 0x1f;
    (J->fold).ins.field_0.ot = (short)uVar14 + 0x4c00;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = (IRRef1)val;
    lj_opt_fold(J);
    if ((cVar1 != '\0') && (uVar14 - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5900;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)val;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    TVar4 = 0;
  }
  return TVar4;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lj_assertJ(val == 0, "bad usage");
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
#if LJ_FR2
      J->base[-2] = kfunc;
#else
      J->base[-1] = kfunc | TREF_FRAME;
#endif
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	uref = tref_ref(emitir(IRT(IR_UREFO, IRT_PGC), fn, uv));
	emitir(IRTG(IR_EQ, IRT_PGC),
	       REF_BASE,
	       emitir(IRT(IR_ADD, IRT_PGC), uref,
		      lj_ir_kintpgc(J, (slot - 1 - LJ_FR2) * -8)));
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    /* IR_UREFO+IRT_IGC is not checked for open-ness at runtime.
    ** Always marked as a guard, since it might get promoted to IRT_PGC later.
    */
    uref = emitir(IRTG(IR_UREFO, tref_isgcv(val) ? IRT_PGC : IRT_IGC), fn, uv);
    uref = tref_ref(uref);
    emitir(IRTG(IR_UGT, IRT_PGC),
	   emitir(IRT(IR_SUB, IRT_PGC), uref, REF_BASE),
	   lj_ir_kintpgc(J, (J->baseslot + J->maxslot) * 8));
  } else {
    /* If fn is constant, then so is the GCupval*, and the upvalue cannot
    ** transition back to open, so no guard is required in this case.
    */
    IRType t = (tref_isk(fn) ? 0 : IRT_GUARD) | IRT_PGC;
    uref = tref_ref(emitir(IRT(IR_UREFC, t), fn, uv));
    needbarrier = 1;
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}